

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::property::parse_reference(property *this,text_input_buffer *input)

{
  char cVar1;
  ulong uVar2;
  string local_c8;
  string local_98;
  undefined1 local_78 [8];
  property_value v;
  text_input_buffer *input_local;
  property *this_local;
  
  v._88_8_ = input;
  cVar1 = text_input_buffer::operator*(input);
  if (cVar1 == '&') {
    text_input_buffer::operator++((text_input_buffer *)v._88_8_);
    text_input_buffer::next_token((text_input_buffer *)v._88_8_);
    std::__cxx11::string::string((string *)&local_98);
    property_value::property_value((property_value *)local_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    text_input_buffer::parse_node_name_abi_cxx11_(&local_c8,(text_input_buffer *)v._88_8_);
    std::__cxx11::string::operator=
              ((string *)(v.label.field_2._M_local_buf + 8),(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      v.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 3;
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                (&this->values,(value_type *)local_78);
    }
    else {
      text_input_buffer::parse_error((text_input_buffer *)v._88_8_,"Expected node name");
      this->valid = false;
    }
    property_value::~property_value((property_value *)local_78);
    return;
  }
  __assert_fail("*input == \'&\'",
                "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",0x1a0
                ,"void dtc::fdt::property::parse_reference(text_input_buffer &)");
}

Assistant:

void
property::parse_reference(text_input_buffer &input)
{
	assert(*input == '&');
	++input;
	input.next_token();
	property_value v;
	v.string_data = input.parse_node_name();
	if (v.string_data.empty())
	{
		input.parse_error("Expected node name");
		valid = false;
		return;
	}
	v.type = property_value::CROSS_REFERENCE;
	values.push_back(v);
}